

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageStack.h
# Opt level: O2

void __thiscall PageStack<FinalizableObject_*>::Abort(PageStack<FinalizableObject_*> *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  Chunk *temp;
  Chunk *chunk;
  undefined8 *in_FS_OFFSET;
  
  chunk = this->currentChunk;
  if (chunk == (Chunk *)0x0) {
    if (this->count != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar1 = (undefined4 *)*in_FS_OFFSET;
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/PageStack.h"
                         ,0x16e,"(count == 0)","count == 0");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
  }
  else {
    while (chunk->nextChunk != (Chunk *)0x0) {
      this->currentChunk = chunk->nextChunk;
      FreeChunk(this,chunk);
      chunk = this->currentChunk;
    }
    this->chunkStart = (FinalizableObject **)(chunk + 1);
    this->chunkEnd = (FinalizableObject **)(chunk + 0x80);
    this->nextEntry = (FinalizableObject **)(chunk + 1);
    this->count = 0;
  }
  return;
}

Assistant:

void PageStack<T>::Abort()
{
    // Abandon the current entries in the stack and reset to initialized state.

    if (currentChunk == nullptr)
    {
        Assert(count == 0);
        return;
    }

    // Free all the chunks except the first one
    while (currentChunk->nextChunk != nullptr)
    {
        Chunk * temp = currentChunk;
        currentChunk = currentChunk->nextChunk;
        FreeChunk(temp);
    }

    chunkStart = currentChunk->entries;
    chunkEnd = &currentChunk->entries[EntriesPerChunk];
    nextEntry = chunkStart;

#if DBG
    count = 0;
#endif
}